

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_map_get_size(JSContext *ctx,JSValue this_val,int magic)

{
  uint uVar1;
  void *pvVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  JSValue JVar6;
  
  pvVar2 = JS_GetOpaque2(ctx,this_val,magic + 0x1f);
  if (pvVar2 == (void *)0x0) {
    JVar3.float64 = 0.0;
    iVar5 = 6;
  }
  else {
    uVar1 = *(uint *)((long)pvVar2 + 0x18);
    JVar4 = (JSValueUnion)(long)(int)uVar1;
    JVar3.float64 = (double)uVar1;
    if (-1 < (long)JVar4.ptr) {
      JVar3 = JVar4;
    }
    iVar5 = 7;
    if (-1 < (long)JVar4.ptr) {
      iVar5 = 0;
    }
  }
  JVar6.tag = iVar5;
  JVar6.u.float64 = JVar3.float64;
  return JVar6;
}

Assistant:

static JSValue js_map_get_size(JSContext *ctx, JSValueConst this_val, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    if (!s)
        return JS_EXCEPTION;
    return JS_NewUint32(ctx, s->record_count);
}